

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

dsListEntry * dsListAdd(dsList *list,void *data)

{
  int iVar1;
  dsListEntry *address;
  uint64_t uVar2;
  uint64_t uVar3;
  void *pvVar4;
  char *fmt;
  
  if (list == (dsList *)0x0) {
    dsRunLogCallback("%s(): Bad argument: %p\n","dsListAdd",0);
    return (dsListEntry *)0x0;
  }
  address = (dsListEntry *)dsAlloc(0x20);
  if (address == (dsListEntry *)0x0) {
    fmt = "%s(): Can\'t allocate list entry object.\n";
LAB_001036ec:
    address = (dsListEntry *)0x0;
    dsRunLogCallback(fmt,"dsListAdd");
  }
  else {
    uVar2 = dsOffset(address);
    uVar3 = dsOffset(data);
    dsRunLogCallback("%s(): listEntryOffset: %lu, dataOffset: %lu\n","dsListAdd",uVar2,uVar3);
    if (list->headOffset == 0xffffffffffffffff) {
      address->magic = 0x79746e457473696c;
      address->dataOffset = uVar3;
      *(undefined4 *)&address->prevOffset = 0xffffffff;
      *(undefined4 *)((long)&address->prevOffset + 4) = 0xffffffff;
      *(undefined4 *)&address->nextOffset = 0xffffffff;
      *(undefined4 *)((long)&address->nextOffset + 4) = 0xffffffff;
    }
    else {
      pvVar4 = dsPtr(list->headOffset,0x20);
      if (pvVar4 == (void *)0x0) {
        dsRunLogCallback("%s(): Can\'t map list next offset.\n","dsListAdd");
        iVar1 = dsFree(address);
        if (-1 < iVar1) {
          return (dsListEntry *)0x0;
        }
        fmt = "%s(): Can\'t free list entry object.\n";
        goto LAB_001036ec;
      }
      address->magic = 0x79746e457473696c;
      address->dataOffset = uVar3;
      address->prevOffset = 0xffffffffffffffff;
      address->nextOffset = list->headOffset;
      *(uint64_t *)((long)pvVar4 + 8) = uVar2;
    }
    list->headOffset = uVar2;
    list->count = list->count + 1;
  }
  return address;
}

Assistant:

dsListEntry *
dsListAdd(dsList *list, void *data)
{
	dsListEntry *entry;
	dsListEntry *next;
	uint64_t listEntryOffset;
	uint64_t dataOffset;

	if (list == NULL) {
		dsLog("Bad argument: %p\n", list);
		return(NULL);
	}

	if ((entry = dsAlloc(sizeof(*entry))) == NULL) {
		dsLog("Can't allocate list entry object.\n");
		return(NULL);
	}

	listEntryOffset = dsOffset(entry);
	dataOffset = dsOffset(data);

	dsLog("listEntryOffset: %" PRIu64 ", dataOffset: %" PRIu64 "\n",\
		  listEntryOffset, dataOffset);

	/*
	 * Found the entry to remove.
	 */
	next = NULL;
	if (list->headOffset != UINT64_MAX) {
		if ((next = dsPtr(list->headOffset, sizeof(*next))) == NULL) {
			dsLog("Can't map list next offset.\n");
			if (dsFree(entry) < 0) {
				dsLog("Can't free list entry object.\n");
			}
			return(NULL);
		}
	}

	entry->magic = MAGIC_LISTENTRY;
	entry->dataOffset = dataOffset;
	entry->prevOffset = UINT64_MAX;
	entry->nextOffset = list->headOffset;
	if (next != NULL) {
		next->prevOffset = listEntryOffset;
	}
	list->headOffset = listEntryOffset;
	list->count++;

	return(entry);
}